

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationValue.cpp
# Opt level: O0

float Corrade::Utility::Implementation::FloatConfigurationValue<float>::fromString
                (string *stringValue,ConfigurationValueFlags flags)

{
  bool bVar1;
  ulong uVar2;
  float local_1b4;
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_1ae;
  EnumSet local_1ad;
  float value;
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_19a;
  EnumSet local_199;
  long local_198;
  istringstream stream;
  string *stringValue_local;
  ConfigurationValueFlags flags_local;
  
  stringValue_local._3_1_ = flags._value;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::istringstream::istringstream((istringstream *)&local_198,stringValue,8);
    Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_19a,Scientific);
    local_199 = (EnumSet)Containers::
                         EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::
                         operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                    *)((long)&stringValue_local + 3),local_19a);
    bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_199);
    if (bVar1) {
      std::ios_base::setf((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),
                          _S_scientific,_S_floatfield);
    }
    Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_1ae,Uppercase);
    local_1ad = (EnumSet)Containers::
                         EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::
                         operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                    *)((long)&stringValue_local + 3),local_1ae);
    bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_1ad);
    if (bVar1) {
      std::ios_base::setf((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),_S_uppercase
                         );
    }
    std::istream::operator>>(&local_198,&local_1b4);
    stringValue_local._4_4_ = local_1b4;
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_198);
  }
  else {
    stringValue_local._4_4_ = 0.0;
  }
  return stringValue_local._4_4_;
}

Assistant:

T FloatConfigurationValue<T>::fromString(const std::string& stringValue, ConfigurationValueFlags flags) {
        if(stringValue.empty()) return T{};

        std::istringstream stream{stringValue};

        /* Scientific notation */
        if(flags & ConfigurationValueFlag::Scientific)
            stream.setf(std::istringstream::scientific, std::istringstream::floatfield);

        if(flags & ConfigurationValueFlag::Uppercase)
            stream.setf(std::istringstream::uppercase);

        T value;
        stream >> value;
        return value;
    }